

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  byte bVar1;
  uint16_t uVar2;
  LYS_NODE LVar3;
  char *expr;
  int iVar4;
  lys_node *node_00;
  lys_module *plVar5;
  LY_ERR *pLVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *unaff_R12;
  long lVar9;
  long lStack_80;
  undefined1 auStack_78 [8];
  lyxp_set set;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x160e,"int resolve_must(struct lyd_node *, int, int)");
  }
  set.val._8_8_ = 0;
  set.used = 0;
  set.size = 0;
  set._8_8_ = 0;
  set.val.nodes = (lyxp_set_nodes *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  set.type = LYXP_SET_EMPTY;
  set._4_4_ = 0;
  node_00 = node->schema;
  if (inout_parent == 0) {
    LVar3 = node_00->nodetype;
    if (LVar3 == LYS_CONTAINER) {
      lStack_80 = 0x1e;
LAB_0011bf42:
      bVar1 = node_00->padding[lStack_80 + -0x1c];
LAB_0011bf46:
      uVar7 = (ulong)bVar1;
      unaff_R12 = node_00[1].dsc;
    }
    else {
      if ((LVar3 == LYS_ANYDATA) || (LVar3 == LYS_LEAFLIST)) {
LAB_0011bf40:
        lStack_80 = 0x1f;
        goto LAB_0011bf42;
      }
      if (LVar3 == LYS_LIST) {
        lStack_80 = 0x1c;
        goto LAB_0011bf42;
      }
      if (((LVar3 == LYS_ANYXML) || (LVar3 == LYS_NOTIF)) || (LVar3 == LYS_LEAF)) goto LAB_0011bf40;
      uVar7 = 0;
    }
    uVar2 = node_00->flags;
    for (lVar9 = 0; uVar7 * 0x38 != lVar9; lVar9 = lVar9 + 0x38) {
      expr = *(char **)(unaff_R12 + lVar9);
      plVar5 = lyd_node_module(node);
      iVar4 = lyxp_eval(expr,node,LYXP_NODE_ELEM,plVar5,(lyxp_set *)auStack_78,1);
      if (iVar4 != 0) goto LAB_0011beff;
      plVar5 = lyd_node_module(node);
      lyxp_set_cast((lyxp_set *)auStack_78,LYXP_SET_BOOLEAN,node,plVar5,1);
      if (set._8_4_ == 0) {
        if ((ignore_fail == 2 & (byte)(uVar2 >> 9) & 1) == 0 && ignore_fail != 1) {
          ly_vlog(LYE_NOMUST,LY_VLOG_LYD,node,*(undefined8 *)(unaff_R12 + lVar9));
          if (*(long *)(unaff_R12 + lVar9 + 0x20) != 0) {
            ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0);
          }
          if (*(long *)(unaff_R12 + lVar9 + 0x18) == 0) {
            return 1;
          }
          pLVar6 = ly_errno_location();
          strncpy((char *)(pLVar6 + 0x206),*(char **)(unaff_R12 + lVar9 + 0x18),0x7f);
          return 1;
        }
        if ('\x01' < ly_log_level) {
          ly_log(LY_LLVRB,"Must condition \"%s\" not satisfied, but it is not required.",
                 *(undefined8 *)(unaff_R12 + lVar9));
        }
      }
    }
    iVar4 = 0;
  }
  else {
    do {
      node_00 = lys_parent(node_00);
      if (node_00 == (lys_node *)0x0) goto LAB_0011bed8;
    } while ((node_00->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if ((node_00->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
LAB_0011bed8:
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EINT;
      uVar8 = 0x1616;
    }
    else {
      node = node->parent;
      if ((node->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        bVar1 = node_00->padding[3];
        goto LAB_0011bf46;
      }
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EINT;
      uVar8 = 0x1621;
    }
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c",
           uVar8);
LAB_0011beff:
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    int node_flags;
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT;
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        node_flags = schema->flags;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT;
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }

        node_flags = node->schema->flags;
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((node_flags & LYS_XPATH_DEP) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, must[i].emsg);
                }
                if (must[i].eapptag) {
                    strncpy(((struct ly_err *)&ly_errno)->apptag, must[i].eapptag, LY_APPTAG_LEN - 1);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}